

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::tetalldihedral
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double *cosdd,double *cosmaxd,
          double *cosmind)

{
  double (*padVar1) [3];
  long lVar2;
  long lVar3;
  double (*N_00) [3];
  ulong uVar4;
  double dVar5;
  double dVar6;
  double vol;
  double N [4] [3];
  
  vol = 0.0;
  N_00 = N;
  tetallnormal(this,pa,pb,pc,pd,N_00,&vol);
  dVar5 = vol;
  if (0.0 < vol) {
    padVar1 = N;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar6 = SQRT(N[lVar2][2] * N[lVar2][2] + N[lVar2][0] * N[lVar2][0] + N[lVar2][1] * N[lVar2][1]
                  );
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
          (*padVar1)[lVar3] = (*padVar1)[lVar3] / dVar6;
        }
      }
      else {
        vol = 0.0;
        dVar5 = 0.0;
      }
      padVar1 = padVar1 + 1;
    }
  }
  if (dVar5 <= 0.0) {
    facenormal(this,pc,pb,pd,*N_00,1,(double *)0x0);
    facenormal(this,pa,pc,pd,N[1],1,(double *)0x0);
    facenormal(this,pb,pa,pd,N[2],1,(double *)0x0);
    facenormal(this,pa,pb,pc,N[3],1,(double *)0x0);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar5 = SQRT(N[lVar2][2] * N[lVar2][2] + N[lVar2][0] * N[lVar2][0] + N[lVar2][1] * N[lVar2][1]
                  );
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        if (cosdd != (double *)0x0) {
          for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
            cosdd[lVar2] = -1.0;
          }
        }
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = -1.0;
        }
        if (cosmind != (double *)0x0) {
          *cosmind = -1.0;
        }
        return false;
      }
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        (*N_00)[lVar3] = (*N_00)[lVar3] / dVar5;
      }
      N_00 = N_00 + 1;
    }
  }
  lVar2 = 0;
  do {
    if (lVar2 == 6) {
      return true;
    }
    dVar5 = N[0][2] * N[1][2] + N[0][0] * N[1][0] + N[0][1] * N[1][1];
    uVar4 = -(ulong)(1.0 < dVar5);
    dVar6 = (double)(uVar4 & 0xbff0000000000000 | ~uVar4 & (ulong)-dVar5);
    dVar5 = 1.0;
    if (dVar6 <= 1.0) {
      dVar5 = dVar6;
    }
    if (cosdd != (double *)0x0) {
      cosdd[lVar2] = dVar5;
    }
    if (cosmaxd != (double *)0x0 || cosmind != (double *)0x0) {
      if (lVar2 == 0) {
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = dVar5;
        }
        if (cosmind != (double *)0x0) goto LAB_001176b5;
      }
      else {
        if (cosmaxd != (double *)0x0) {
          dVar6 = dVar5;
          if (*cosmaxd <= dVar5) {
            dVar6 = *cosmaxd;
          }
          *cosmaxd = dVar6;
        }
        if (cosmind != (double *)0x0) {
          if (dVar5 <= *cosmind) {
            dVar5 = *cosmind;
          }
LAB_001176b5:
          *cosmind = dVar5;
        }
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

bool tetgenmesh::tetalldihedral(point pa, point pb, point pc, point pd,
                                REAL* cosdd, REAL* cosmaxd, REAL* cosmind)
{
  REAL N[4][3], vol, cosd, len;
  int f1 = 0, f2 = 0, i, j;

  vol = 0; // Check if the tet is valid or not.

  // Get four normals of faces of the tet.
  tetallnormal(pa, pb, pc, pd, N, &vol);

  if (vol > 0) {
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        vol = 0; //assert(0);
      }
    }
  }

  if (vol <= 0) { // if (vol == 0.0) {
    // A degenerated tet or an inverted tet.
    facenormal(pc, pb, pd, N[0], 1, NULL);
    facenormal(pa, pc, pd, N[1], 1, NULL);
    facenormal(pb, pa, pd, N[2], 1, NULL);
    facenormal(pa, pb, pc, N[3], 1, NULL);
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        break; // Not a valid normal.
      }
    }
    if (i < 4) {
      // Do not calculate dihedral angles.
      // Set all angles be 0 degree. There will be no quality optimization for
      //   this tet! Use volume optimization to correct it.
      if (cosdd != NULL) {
        for (i = 0; i < 6; i++) {
          cosdd[i] = -1.0; // 180 degree.
        }
      }
      // This tet has zero volume.
      if (cosmaxd != NULL) {
        *cosmaxd = -1.0; // 180 degree.
      }
      if (cosmind != NULL) {
        *cosmind = -1.0; // 180 degree.
      }
      return false;
    }
  }

  // Calculate the cosine of the dihedral angles of the edges.
  for (i = 0; i < 6; i++) {
    switch (i) {
    case 0: f1 = 0; f2 = 1; break; // [c,d].
    case 1: f1 = 1; f2 = 2; break; // [a,d].
    case 2: f1 = 2; f2 = 3; break; // [a,b].
    case 3: f1 = 0; f2 = 3; break; // [b,c].
    case 4: f1 = 2; f2 = 0; break; // [b,d].
    case 5: f1 = 1; f2 = 3; break; // [a,c].
    }
    cosd = -dot(N[f1], N[f2]);
    if (cosd < -1.0) cosd = -1.0; // Rounding.
    if (cosd >  1.0) cosd =  1.0; // Rounding.
    if (cosdd) cosdd[i] = cosd;
    if (cosmaxd || cosmind) {
      if (i == 0) {
        if (cosmaxd) *cosmaxd = cosd;
        if (cosmind) *cosmind = cosd;
      } else {
        if (cosmaxd) *cosmaxd = cosd < *cosmaxd ? cosd : *cosmaxd;
        if (cosmind) *cosmind = cosd > *cosmind ? cosd : *cosmind;
      }
    }
  }

  return true;
}